

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

Epoch __thiscall
anon_unknown.dwarf_16bd48::SQLiteBuildDB::getCurrentEpoch
          (SQLiteBuildDB *this,bool *success_out,string *error_out)

{
  uint uVar1;
  int iVar2;
  int __oflag;
  uint64_t iteration;
  string local_68;
  int local_44;
  undefined8 uStack_40;
  int result;
  sqlite3_stmt *stmt;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  bool *success_out_local;
  SQLiteBuildDB *this_local;
  
  guard._M_device = (mutex_type *)error_out;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->dbMutex);
  uVar1 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar1 & 1) == 0) {
    *success_out = false;
    this_local = (SQLiteBuildDB *)0x0;
  }
  else {
    local_44 = sqlite3_prepare_v2(this->db,"SELECT iteration FROM info LIMIT 1",0xffffffff,
                                  &stack0xffffffffffffffc0,0);
    if (local_44 == 0) {
      local_44 = sqlite3_step(uStack_40);
      if (local_44 == 100) {
        iVar2 = sqlite3_column_count(uStack_40);
        if (iVar2 != 1) {
          __assert_fail("sqlite3_column_count(stmt) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x183,
                        "virtual Epoch (anonymous namespace)::SQLiteBuildDB::getCurrentEpoch(bool *, std::string *)"
                       );
        }
        this_local = (SQLiteBuildDB *)sqlite3_column_int64(uStack_40,0);
        sqlite3_finalize(uStack_40);
        *success_out = true;
      }
      else {
        *success_out = false;
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                  ((string *)&iteration,this);
        std::__cxx11::string::operator=((string *)guard._M_device,(string *)&iteration);
        std::__cxx11::string::~string((string *)&iteration);
        sqlite3_finalize(uStack_40);
        this_local = (SQLiteBuildDB *)0x0;
      }
    }
    else {
      *success_out = false;
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_68,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      this_local = (SQLiteBuildDB *)0x0;
    }
  }
  stmt._4_4_ = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return (Epoch)this_local;
}

Assistant:

virtual Epoch getCurrentEpoch(bool* success_out, std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out)) {
      *success_out = false;
      return 0;
    }

    // Fetch the iteration from the info table.
    sqlite3_stmt* stmt;
    int result;
    result = sqlite3_prepare_v2(
      db, "SELECT iteration FROM info LIMIT 1",
      -1, &stmt, nullptr);
    if (result != SQLITE_OK) {
      *success_out = false;
      *error_out = getCurrentErrorMessage();
      return 0;
    }

    result = sqlite3_step(stmt);
    if (result != SQLITE_ROW) {
      *success_out = false;
      *error_out = getCurrentErrorMessage();
      sqlite3_finalize(stmt);
      return 0;
    }

    assert(sqlite3_column_count(stmt) == 1);
    uint64_t iteration = sqlite3_column_int64(stmt, 0);

    sqlite3_finalize(stmt);

    *success_out = true;
    return iteration;
  }